

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

RPCHelpMan * wallet::signrawtransactionwithwallet(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  long *plVar3;
  string name;
  string name_00;
  string name_01;
  string name_02;
  string name_03;
  string name_04;
  string name_05;
  string name_06;
  string name_07;
  string name_08;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string name_09;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  Fallback fallback_02;
  Fallback fallback_03;
  Fallback fallback_04;
  Fallback fallback_05;
  Fallback fallback_06;
  Fallback fallback_07;
  Fallback fallback_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string description_19;
  string description_20;
  string description_21;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_11;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_12;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  RPCArgOptions opts_02;
  RPCArgOptions opts_03;
  RPCArgOptions opts_04;
  RPCArgOptions opts_05;
  RPCArgOptions opts_06;
  undefined1 auVar4 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long *plVar6;
  undefined8 uVar7;
  RPCHelpMan *in_RDI;
  long lVar8;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  undefined4 in_stack_ffffffffffffdf68;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffdf6c;
  undefined1 *puVar10;
  undefined4 uVar11;
  undefined8 in_stack_ffffffffffffdf70;
  undefined8 in_stack_ffffffffffffdf80;
  undefined8 in_stack_ffffffffffffdf88;
  undefined8 in_stack_ffffffffffffdf90;
  undefined8 in_stack_ffffffffffffdf98;
  code *pcVar12;
  undefined8 in_stack_ffffffffffffdfa0;
  undefined1 in_stack_ffffffffffffdfa8 [16];
  pointer in_stack_ffffffffffffdfb8;
  pointer pRVar13;
  pointer in_stack_ffffffffffffdfc0;
  pointer pRVar14;
  pointer in_stack_ffffffffffffdfc8;
  pointer pRVar15;
  pointer pRVar16;
  pointer in_stack_ffffffffffffdfd8;
  pointer pRVar17;
  pointer in_stack_ffffffffffffdfe0;
  pointer pRVar18;
  pointer in_stack_ffffffffffffdfe8;
  pointer pRVar19;
  undefined8 in_stack_ffffffffffffdff0;
  pointer in_stack_ffffffffffffdff8;
  pointer in_stack_ffffffffffffe000;
  pointer in_stack_ffffffffffffe008;
  undefined8 in_stack_ffffffffffffe010;
  pointer in_stack_ffffffffffffe018;
  pointer in_stack_ffffffffffffe020;
  pointer in_stack_ffffffffffffe028;
  _Vector_impl_data in_stack_ffffffffffffe030;
  pointer in_stack_ffffffffffffe048;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1f98;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1f78;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1f60;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1f48;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1f28;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1f10;
  RPCResults local_1ef8;
  allocator_type local_1edb;
  allocator_type local_1eda;
  allocator_type local_1ed9;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1ed8;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1ec0;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1ea8;
  string local_1e90;
  string local_1e70;
  string local_1e50;
  string local_1e30;
  string local_1e10;
  string local_1df0;
  ulong *local_1dd0;
  undefined8 local_1dc8;
  ulong local_1dc0;
  undefined8 uStack_1db8;
  ulong *local_1db0;
  size_type local_1da8;
  ulong local_1da0;
  undefined8 uStack_1d98;
  long *local_1d90 [2];
  long local_1d80 [2];
  long *local_1d70 [2];
  long local_1d60 [2];
  long *local_1d50 [2];
  long local_1d40 [2];
  long *local_1d30 [2];
  long local_1d20 [2];
  long *local_1d10 [2];
  long local_1d00 [2];
  long *local_1cf0 [2];
  long local_1ce0 [2];
  long *local_1cd0 [2];
  long local_1cc0 [2];
  long *local_1cb0 [2];
  long local_1ca0 [2];
  RPCResult local_1c90;
  long *local_1c08 [2];
  long local_1bf8 [2];
  long *local_1be8 [2];
  long local_1bd8 [2];
  long *local_1bc8 [2];
  long local_1bb8 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1ba8;
  long *local_1b88 [2];
  long local_1b78 [2];
  pointer local_1b68 [2];
  undefined1 local_1b58 [152];
  RPCResult local_1ac0;
  RPCResult local_1a38;
  RPCResult local_19b0;
  RPCResult local_1928;
  RPCResult local_18a0;
  long *local_1818 [2];
  long local_1808 [2];
  long *local_17f8 [2];
  long local_17e8 [2];
  RPCResult local_17d8;
  long *local_1750 [2];
  long local_1740 [2];
  long *local_1730 [2];
  long local_1720 [2];
  long *local_1710 [2];
  long local_1700 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_16f0;
  long *local_16d0 [2];
  long local_16c0 [2];
  pointer local_16b0 [2];
  undefined1 local_16a0 [152];
  RPCResult local_1608;
  RPCResult local_1580;
  long *local_14f8 [2];
  long local_14e8 [2];
  long *local_14d8 [2];
  long local_14c8 [2];
  RPCResult local_14b8;
  undefined1 local_1430;
  undefined1 *local_1428;
  undefined8 local_1420;
  undefined1 local_1418;
  undefined7 uStack_1417;
  undefined1 local_1408 [32];
  long *local_13e8 [2];
  long local_13d8 [2];
  UniValue local_13c8;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1370;
  undefined1 local_1318;
  long *local_1310 [2];
  long local_1300 [2];
  undefined1 local_12f0 [8];
  undefined1 *local_12e8;
  undefined8 local_12e0;
  undefined1 local_12d8;
  undefined7 uStack_12d7;
  undefined1 local_12c8 [32];
  undefined1 local_12a8 [8];
  undefined1 *local_12a0;
  undefined8 local_1298;
  undefined1 local_1290;
  undefined7 uStack_128f;
  undefined1 local_1280 [32];
  undefined1 local_1260;
  undefined1 *local_1258;
  undefined8 local_1250;
  undefined1 local_1248;
  undefined7 uStack_1247;
  undefined1 local_1238 [32];
  long *local_1218 [2];
  long local_1208 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_11f8;
  undefined1 local_11a0;
  long *local_1198 [2];
  long local_1188 [2];
  undefined1 local_1178;
  undefined1 *local_1170;
  undefined8 local_1168;
  undefined1 local_1160;
  undefined7 uStack_115f;
  undefined1 local_1150 [32];
  long *local_1130 [2];
  long local_1120 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1110;
  undefined1 local_10b8;
  long *local_10b0 [2];
  long local_10a0 [2];
  undefined1 local_1090;
  undefined1 *local_1088;
  undefined8 local_1080;
  undefined1 local_1078;
  undefined7 uStack_1077;
  undefined1 local_1068 [32];
  long *local_1048 [2];
  long local_1038 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1028;
  undefined1 local_fd0;
  long *local_fc8 [2];
  long local_fb8 [2];
  undefined1 local_fa8;
  undefined1 *local_fa0;
  undefined8 local_f98;
  undefined1 local_f90;
  undefined7 uStack_f8f;
  undefined1 local_f80 [32];
  long *local_f60 [2];
  long local_f50 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_f40;
  undefined1 local_ee8;
  long *local_ee0 [2];
  long local_ed0 [2];
  undefined1 local_ec0;
  undefined1 *local_eb8;
  undefined8 local_eb0;
  undefined1 local_ea8;
  undefined7 uStack_ea7;
  undefined1 local_e98 [32];
  long *local_e78 [2];
  long local_e68 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_e58;
  undefined1 local_e00;
  long *local_df8 [2];
  long local_de8 [2];
  undefined1 local_dd8;
  vector<RPCArg,_std::allocator<RPCArg>_> local_dd0;
  undefined1 auStack_db8 [8];
  undefined1 local_db0 [32];
  long *local_d90 [2];
  long local_d80 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_d70;
  undefined1 local_d18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d10;
  RPCArg local_cf0;
  RPCArg local_be8;
  RPCArg local_ae0;
  RPCArg local_9d8;
  RPCArg local_8d0;
  RPCArg local_7c8;
  long *local_6c0 [2];
  long local_6b0 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_6a0;
  undefined1 local_648;
  long *local_640 [2];
  long local_630 [2];
  RPCArg local_620;
  long *local_518 [2];
  long local_508 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_4f8;
  undefined1 local_4a0;
  long *local_498 [2];
  long local_488 [2];
  undefined1 local_478;
  vector<RPCArg,_std::allocator<RPCArg>_> local_470;
  undefined1 auStack_458 [8];
  undefined1 local_450 [32];
  long *local_430 [2];
  long local_420 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_410;
  undefined1 local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b0;
  RPCArg local_390;
  RPCArg local_288;
  RPCArg local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1038[1] = 0;
  pRVar16 = (pointer)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"signrawtransactionwithwallet","");
  std::operator+(&local_78,
                 "\nSign inputs for raw transaction (serialized, hex-encoded).\nThe second optional argument (may be null) is an array of previous transaction outputs that\nthis transaction depends on but may not yet be in the block chain."
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &HELP_REQUIRING_PASSPHRASE_abi_cxx11_);
  local_3b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_3b0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"hexstring","");
  local_410._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_3b8 = 0;
  local_430[0] = local_420;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_430,"The transaction hex string","");
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_478 = 0;
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_450._0_8_ = (pointer)0x0;
  local_450._8_2_ = 0;
  local_450._10_6_ = 0;
  local_450._16_2_ = 0;
  local_450._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdf6c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdf68;
  name._M_string_length = in_stack_ffffffffffffdf70;
  name.field_2._M_allocated_capacity = (size_type)in_RDI;
  name.field_2._8_8_ = in_stack_ffffffffffffdf80;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffdf90;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffdf88;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffdf98;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffdfa0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffdfa8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffdfb8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffdfc0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffdfc8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = pRVar16;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffdfd8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffdfe0;
  description_12._M_string_length = in_stack_ffffffffffffdff0;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdfe8;
  description_12.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdff8;
  description_12.field_2._8_8_ = in_stack_ffffffffffffe000;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe010;
  opts._0_8_ = in_stack_ffffffffffffe008;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe018;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe020;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe028;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffe030;
  opts._64_8_ = in_stack_ffffffffffffe048;
  ::RPCArg::RPCArg(&local_390,name,(Type)&local_3b0,fallback,description_12,opts);
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"prevtxs","");
  local_4f8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_4a0 = 0;
  local_518[0] = local_508;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_518,"The previous dependent transaction outputs","");
  local_640[0] = local_630;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"");
  local_6a0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_648 = 0;
  local_6c0[0] = local_6b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6c0,"");
  local_d10.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_d10.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d10,"txid","");
  local_d70._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_d18 = 0;
  local_d90[0] = local_d80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d90,"The transaction id","");
  local_dd0.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_dd0.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_dd8 = 0;
  local_dd0.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_dd0.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_db0._0_8_ = (pointer)0x0;
  local_db0._8_2_ = 0;
  local_db0._10_6_ = 0;
  local_db0._16_2_ = 0;
  local_db0._18_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdf6c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdf68;
  name_00._M_string_length = in_stack_ffffffffffffdf70;
  name_00.field_2._M_allocated_capacity = (size_type)in_RDI;
  name_00.field_2._8_8_ = in_stack_ffffffffffffdf80;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffdf90;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffdf88;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffdf98;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffdfa0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffdfa8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffdfb8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffdfc0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffdfc8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = pRVar16;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffdfd8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffdfe0;
  description_13._M_string_length = in_stack_ffffffffffffdff0;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdfe8;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdff8;
  description_13.field_2._8_8_ = in_stack_ffffffffffffe000;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe010;
  opts_00._0_8_ = in_stack_ffffffffffffe008;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe018;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe020;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe028;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffe030;
  opts_00._64_8_ = in_stack_ffffffffffffe048;
  ::RPCArg::RPCArg(&local_cf0,name_00,(Type)&local_d10,fallback_00,description_13,opts_00);
  local_df8[0] = local_de8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_df8,"vout","");
  local_e58._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_e00 = 0;
  local_e78[0] = local_e68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e78,"The output number","");
  local_eb8 = &local_ea8;
  local_ec0 = 0;
  local_eb0 = 0;
  local_ea8 = 0;
  local_e98._0_8_ = (pointer)0x0;
  local_e98._8_2_ = 0;
  local_e98._10_6_ = 0;
  local_e98._16_2_ = 0;
  local_e98._18_8_ = 0;
  name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdf6c;
  name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdf68;
  name_01._M_string_length = in_stack_ffffffffffffdf70;
  name_01.field_2._M_allocated_capacity = (size_type)in_RDI;
  name_01.field_2._8_8_ = in_stack_ffffffffffffdf80;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffdf90;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffdf88;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffdf98;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffdfa0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffdfa8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffdfb8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffdfc0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffdfc8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = pRVar16;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffdfd8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffdfe0;
  description_14._M_string_length = in_stack_ffffffffffffdff0;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdfe8;
  description_14.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdff8;
  description_14.field_2._8_8_ = in_stack_ffffffffffffe000;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe010;
  opts_01._0_8_ = in_stack_ffffffffffffe008;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe018;
  opts_01.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe020;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe028;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffe030;
  opts_01._64_8_ = in_stack_ffffffffffffe048;
  ::RPCArg::RPCArg(&local_be8,name_01,(Type)local_df8,fallback_01,description_14,opts_01);
  local_ee0[0] = local_ed0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ee0,"scriptPubKey","");
  local_f40._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_ee8 = 0;
  local_f60[0] = local_f50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f60,"The output script","");
  local_fa0 = &local_f90;
  local_fa8 = 0;
  local_f98 = 0;
  local_f90 = 0;
  local_f80._0_8_ = (pointer)0x0;
  local_f80._8_2_ = 0;
  local_f80._10_6_ = 0;
  local_f80._16_2_ = 0;
  local_f80._18_8_ = 0;
  name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdf6c;
  name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdf68;
  name_02._M_string_length = in_stack_ffffffffffffdf70;
  name_02.field_2._M_allocated_capacity = (size_type)in_RDI;
  name_02.field_2._8_8_ = in_stack_ffffffffffffdf80;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffdf90;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffdf88;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffdf98;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffdfa0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffdfa8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffdfb8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffdfc0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffdfc8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = pRVar16;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffdfd8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffdfe0;
  description_15._M_string_length = in_stack_ffffffffffffdff0;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdfe8;
  description_15.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdff8;
  description_15.field_2._8_8_ = in_stack_ffffffffffffe000;
  opts_02.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe010;
  opts_02._0_8_ = in_stack_ffffffffffffe008;
  opts_02.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe018;
  opts_02.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe020;
  opts_02.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe028;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffe030;
  opts_02._64_8_ = in_stack_ffffffffffffe048;
  ::RPCArg::RPCArg(&local_ae0,name_02,(Type)local_ee0,fallback_02,description_15,opts_02);
  local_fc8[0] = local_fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fc8,"redeemScript","");
  local_1028._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_fd0 = 0;
  local_1048[0] = local_1038;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1048,"(required for P2SH) redeem script","");
  local_1088 = &local_1078;
  local_1090 = 0;
  local_1080 = 0;
  local_1078 = 0;
  local_1068._0_8_ = (pointer)0x0;
  local_1068._8_2_ = 0;
  local_1068._10_6_ = 0;
  local_1068._16_2_ = 0;
  local_1068._18_8_ = 0;
  name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdf6c;
  name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdf68;
  name_03._M_string_length = in_stack_ffffffffffffdf70;
  name_03.field_2._M_allocated_capacity = (size_type)in_RDI;
  name_03.field_2._8_8_ = in_stack_ffffffffffffdf80;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffdf90;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffdf88;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffdf98;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffdfa0;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffdfa8;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffdfb8;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffdfc0;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffdfc8;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = pRVar16;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffdfd8;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffdfe0;
  description_16._M_string_length = in_stack_ffffffffffffdff0;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdfe8;
  description_16.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdff8;
  description_16.field_2._8_8_ = in_stack_ffffffffffffe000;
  opts_03.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe010;
  opts_03._0_8_ = in_stack_ffffffffffffe008;
  opts_03.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe018;
  opts_03.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe020;
  opts_03.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe028;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffe030;
  opts_03._64_8_ = in_stack_ffffffffffffe048;
  ::RPCArg::RPCArg(&local_9d8,name_03,(Type)local_fc8,fallback_03,description_16,opts_03);
  local_10b0[0] = local_10a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10b0,"witnessScript","");
  local_1110._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_10b8 = 0;
  local_1130[0] = local_1120;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1130,"(required for P2WSH or P2SH-P2WSH) witness script","");
  local_1170 = &local_1160;
  local_1178 = 0;
  local_1168 = 0;
  local_1160 = 0;
  local_1150._0_8_ = (pointer)0x0;
  local_1150._8_2_ = 0;
  local_1150._10_6_ = 0;
  local_1150._16_2_ = 0;
  local_1150._18_8_ = 0;
  name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdf6c;
  name_04._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdf68;
  name_04._M_string_length = in_stack_ffffffffffffdf70;
  name_04.field_2._M_allocated_capacity = (size_type)in_RDI;
  name_04.field_2._8_8_ = in_stack_ffffffffffffdf80;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffdf90;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffdf88;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffdf98;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffdfa0;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffdfa8;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffdfb8;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffdfc0;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffdfc8;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = pRVar16;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffdfd8;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffdfe0;
  description_17._M_string_length = in_stack_ffffffffffffdff0;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdfe8;
  description_17.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdff8;
  description_17.field_2._8_8_ = in_stack_ffffffffffffe000;
  opts_04.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe010;
  opts_04._0_8_ = in_stack_ffffffffffffe008;
  opts_04.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe018;
  opts_04.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe020;
  opts_04.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe028;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffe030;
  opts_04._64_8_ = in_stack_ffffffffffffe048;
  ::RPCArg::RPCArg(&local_8d0,name_04,(Type)local_10b0,fallback_04,description_17,opts_04);
  local_1198[0] = local_1188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1198,"amount","");
  local_11f8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_11a0 = 0;
  local_1218[0] = local_1208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1218,"(required for Segwit inputs) the amount spent","");
  local_1258 = &local_1248;
  local_1260 = 0;
  local_1250 = 0;
  local_1248 = 0;
  local_1238._0_8_ = (pointer)0x0;
  local_1238._8_2_ = 0;
  local_1238._10_6_ = 0;
  local_1238._16_2_ = 0;
  local_1238._18_8_ = 0;
  name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdf6c;
  name_05._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdf68;
  name_05._M_string_length = in_stack_ffffffffffffdf70;
  name_05.field_2._M_allocated_capacity = (size_type)in_RDI;
  name_05.field_2._8_8_ = in_stack_ffffffffffffdf80;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffdf90;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffdf88;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffdf98;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffdfa0;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffdfa8;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffdfb8;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffdfc0;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffdfc8;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = pRVar16;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffdfd8;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffdfe0;
  description_18._M_string_length = in_stack_ffffffffffffdff0;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdfe8;
  description_18.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdff8;
  description_18.field_2._8_8_ = in_stack_ffffffffffffe000;
  opts_05.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe010;
  opts_05._0_8_ = in_stack_ffffffffffffe008;
  opts_05.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe018;
  opts_05.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe020;
  opts_05.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe028;
  opts_05.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffe030;
  opts_05._64_8_ = in_stack_ffffffffffffe048;
  ::RPCArg::RPCArg(&local_7c8,name_05,(Type)local_1198,fallback_05,description_18,opts_05);
  __l._M_len = 6;
  __l._M_array = &local_cf0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1ed8,__l,&local_1ed9);
  local_12a0 = &local_1290;
  local_12a8[0] = 0;
  local_1298 = 0;
  local_1290 = 0;
  local_1280._0_8_ = (pointer)0x0;
  local_1280._8_2_ = 0;
  local_1280._10_6_ = 0;
  local_1280._16_2_ = 0;
  local_1280._18_8_ = 0;
  name_06._M_string_length = in_stack_ffffffffffffdf70;
  name_06._M_dataplus._M_p = local_12a8;
  name_06.field_2._M_allocated_capacity = (size_type)in_RDI;
  name_06.field_2._8_8_ = in_stack_ffffffffffffdf80;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffdf90;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffdf88;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffdf98;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffdfa0;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffdfa8;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffdfb8;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffdfc0;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffdfc8;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = pRVar16;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffdfd8;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffdfe0;
  description_19._M_string_length = in_stack_ffffffffffffdff0;
  description_19._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdfe8;
  description_19.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdff8;
  description_19.field_2._8_8_ = in_stack_ffffffffffffe000;
  inner_11.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe010;
  inner_11.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe008;
  inner_11.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe018;
  ::RPCArg::RPCArg(&local_620,name_06,(Type)local_640,fallback_06,description_19,inner_11,
                   (RPCArgOptions *)0x0);
  __l_00._M_len = 1;
  __l_00._M_array = &local_620;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1ec0,__l_00,&local_1eda);
  local_12e8 = &local_12d8;
  local_12f0[0] = 0;
  local_12e0 = 0;
  local_12d8 = 0;
  local_12c8._0_8_ = (pointer)0x0;
  local_12c8._8_2_ = 0;
  local_12c8._10_6_ = 0;
  local_12c8._16_2_ = 0;
  local_12c8._18_8_ = 0;
  puVar10 = local_12f0;
  name_07._M_string_length = in_stack_ffffffffffffdf70;
  name_07._M_dataplus._M_p = puVar10;
  name_07.field_2._M_allocated_capacity = (size_type)in_RDI;
  name_07.field_2._8_8_ = in_stack_ffffffffffffdf80;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffdf90;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffdf88;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffdf98;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffdfa0;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffdfa8;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffdfb8;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffdfc0;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffdfc8;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = pRVar16;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffdfd8;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffdfe0;
  description_20._M_string_length = in_stack_ffffffffffffdff0;
  description_20._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdfe8;
  description_20.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdff8;
  description_20.field_2._8_8_ = in_stack_ffffffffffffe000;
  inner_12.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe010;
  inner_12.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe008;
  inner_12.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe018;
  ::RPCArg::RPCArg(&local_288,name_07,(Type)local_498,fallback_07,description_20,inner_12,
                   (RPCArgOptions *)0x1);
  local_1310[0] = local_1300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1310,"sighashtype","");
  ::UniValue::UniValue<const_char_(&)[35],_char[35],_true>
            (&local_13c8,(char (*) [35])"DEFAULT for Taproot, ALL otherwise");
  paVar1 = &local_13c8.val.field_2;
  local_1370._8_8_ = (long)&local_1370 + 0x18;
  local_1370._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)
       (_Uninitialized<RPCArg::Optional,_true>)local_13c8.typ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13c8.val._M_dataplus._M_p == paVar1) {
    local_1370._32_8_ = local_13c8.val.field_2._8_8_;
  }
  else {
    local_1370._8_8_ = local_13c8.val._M_dataplus._M_p;
  }
  local_1370._16_8_ = local_13c8.val._M_string_length;
  local_13c8.val._M_string_length = 0;
  local_13c8.val.field_2._M_local_buf[0] = '\0';
  local_1370._40_8_ =
       local_13c8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1370._48_8_ =
       local_13c8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1370._56_8_ =
       local_13c8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_13c8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_13c8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13c8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1370._64_4_ =
       local_13c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_1370._68_4_ =
       local_13c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_1370._72_4_ =
       local_13c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_1370._76_4_ =
       local_13c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_1370._80_8_ =
       local_13c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_13c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1318 = 2;
  local_13e8[0] = local_13d8;
  local_13c8.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13e8,
             "The signature hash type. Must be one of\n       \"DEFAULT\"\n       \"ALL\"\n       \"NONE\"\n       \"SINGLE\"\n       \"ALL|ANYONECANPAY\"\n       \"NONE|ANYONECANPAY\"\n       \"SINGLE|ANYONECANPAY\""
             ,"");
  local_1428 = &local_1418;
  local_1430 = 0;
  local_1420 = 0;
  local_1418 = 0;
  local_1408._0_8_ = (pointer)0x0;
  local_1408._8_2_ = 0;
  local_1408._10_6_ = 0;
  local_1408._16_2_ = 0;
  local_1408._18_8_ = 0;
  name_08._M_string_length = in_stack_ffffffffffffdf70;
  name_08._M_dataplus._M_p = puVar10;
  name_08.field_2._M_allocated_capacity = (size_type)in_RDI;
  name_08.field_2._8_8_ = in_stack_ffffffffffffdf80;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffdf90;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffdf88;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffdf98;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffdfa0;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffdfa8;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffdfb8;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffdfc0;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffdfc8;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = pRVar16;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffdfd8;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffdfe0;
  description_21._M_string_length = in_stack_ffffffffffffdff0;
  description_21._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdfe8;
  description_21.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdff8;
  description_21.field_2._8_8_ = in_stack_ffffffffffffe000;
  opts_06.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe010;
  opts_06._0_8_ = in_stack_ffffffffffffe008;
  opts_06.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe018;
  opts_06.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe020;
  opts_06.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe028;
  opts_06.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffe030;
  opts_06._64_8_ = in_stack_ffffffffffffe048;
  ::RPCArg::RPCArg(&local_180,name_08,(Type)local_1310,fallback_08,description_21,opts_06);
  __l_01._M_len = 3;
  __l_01._M_array = &local_390;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1ea8,__l_01,&local_1edb);
  local_14d8[0] = local_14c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14d8,"");
  local_14f8[0] = local_14e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14f8,"");
  local_16b0[0] = (pointer)local_16a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_16b0,"hex","");
  local_16d0[0] = local_16c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16d0,"The hex-encoded raw transaction with signature(s)","");
  local_1f28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_string_length = in_stack_ffffffffffffdf70;
  m_key_name._M_dataplus._M_p = puVar10;
  m_key_name.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffdf80;
  description._M_string_length = in_stack_ffffffffffffdf90;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdf88;
  description.field_2._M_allocated_capacity = in_stack_ffffffffffffdf98;
  description.field_2._8_8_ = in_stack_ffffffffffffdfa0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffdfb8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffdfa8._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffdfa8._8_8_;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_16a0 + 0x10),STR_HEX,m_key_name,description,inner,
             SUB81(local_16b0,0));
  local_16f0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_16f0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_16f0,"complete","");
  local_1710[0] = local_1700;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1710,"If the transaction has a complete set of signatures","");
  local_1f48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_string_length = in_stack_ffffffffffffdf70;
  m_key_name_00._M_dataplus._M_p = puVar10;
  m_key_name_00.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffdf80;
  description_00._M_string_length = in_stack_ffffffffffffdf90;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdf88;
  description_00.field_2._M_allocated_capacity = in_stack_ffffffffffffdf98;
  description_00.field_2._8_8_ = in_stack_ffffffffffffdfa0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffdfb8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdfa8._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdfa8._8_8_;
  ::RPCResult::RPCResult
            (&local_1608,BOOL,m_key_name_00,description_00,inner_00,SUB81(&local_16f0,0));
  local_1730[0] = local_1720;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1730,"errors","");
  local_1750[0] = local_1740;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1750,"Script verification errors (if there are any)","");
  local_17f8[0] = local_17e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_17f8,"");
  local_1818[0] = local_1808;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1818,"");
  local_1b68[0] = (pointer)local_1b58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b68,"txid","");
  local_1b88[0] = local_1b78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b88,"The hash of the referenced, previous transaction","");
  local_1f98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_string_length = in_stack_ffffffffffffdf70;
  m_key_name_01._M_dataplus._M_p = puVar10;
  m_key_name_01.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffdf80;
  description_01._M_string_length = in_stack_ffffffffffffdf90;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdf88;
  description_01.field_2._M_allocated_capacity = in_stack_ffffffffffffdf98;
  description_01.field_2._8_8_ = in_stack_ffffffffffffdfa0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffdfb8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdfa8._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdfa8._8_8_;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_1b58 + 0x10),STR_HEX,m_key_name_01,description_01,inner_01,
             SUB81(local_1b68,0));
  local_1ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_1ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1ba8,"vout","");
  local_1bc8[0] = local_1bb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1bc8,"The index of the output to spent and used as input","");
  m_key_name_02._M_string_length = in_stack_ffffffffffffdf70;
  m_key_name_02._M_dataplus._M_p = puVar10;
  m_key_name_02.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffdf80;
  description_02._M_string_length = in_stack_ffffffffffffdf90;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdf88;
  description_02.field_2._M_allocated_capacity = in_stack_ffffffffffffdf98;
  description_02.field_2._8_8_ = in_stack_ffffffffffffdfa0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffdfb8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdfa8._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdfa8._8_8_;
  ::RPCResult::RPCResult(&local_1ac0,NUM,m_key_name_02,description_02,inner_02,SUB81(&local_1ba8,0))
  ;
  local_1be8[0] = local_1bd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1be8,"witness","");
  local_1c08[0] = local_1bf8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c08,"");
  local_1cb0[0] = local_1ca0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1cb0,"witness","");
  local_1cd0[0] = local_1cc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1cd0,"");
  m_key_name_03._M_string_length = in_stack_ffffffffffffdf70;
  m_key_name_03._M_dataplus._M_p = puVar10;
  m_key_name_03.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffdf80;
  description_03._M_string_length = in_stack_ffffffffffffdf90;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdf88;
  description_03.field_2._M_allocated_capacity = in_stack_ffffffffffffdf98;
  description_03.field_2._8_8_ = in_stack_ffffffffffffdfa0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffdfb8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdfa8._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdfa8._8_8_;
  ::RPCResult::RPCResult
            (&local_1c90,STR_HEX,m_key_name_03,description_03,inner_03,SUB81(local_1cb0,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_1c90;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe030,__l_02,
             (allocator_type *)&stack0xffffffffffffe017);
  m_key_name_04._M_string_length = in_stack_ffffffffffffdf70;
  m_key_name_04._M_dataplus._M_p = puVar10;
  m_key_name_04.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffdf80;
  description_04._M_string_length = in_stack_ffffffffffffdf90;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdf88;
  description_04.field_2._M_allocated_capacity = in_stack_ffffffffffffdf98;
  description_04.field_2._8_8_ = in_stack_ffffffffffffdfa0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffdfb8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdfa8._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdfa8._8_8_;
  ::RPCResult::RPCResult(&local_1a38,ARR,m_key_name_04,description_04,inner_04,SUB81(local_1be8,0));
  local_1cf0[0] = local_1ce0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1cf0,"scriptSig","");
  local_1d10[0] = local_1d00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d10,"The hex-encoded signature script","");
  m_key_name_05._M_string_length = in_stack_ffffffffffffdf70;
  m_key_name_05._M_dataplus._M_p = puVar10;
  m_key_name_05.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffdf80;
  description_05._M_string_length = in_stack_ffffffffffffdf90;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdf88;
  description_05.field_2._M_allocated_capacity = in_stack_ffffffffffffdf98;
  description_05.field_2._8_8_ = in_stack_ffffffffffffdfa0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffdfb8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdfa8._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdfa8._8_8_;
  ::RPCResult::RPCResult
            (&local_19b0,STR_HEX,m_key_name_05,description_05,inner_05,SUB81(local_1cf0,0));
  local_1d30[0] = local_1d20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d30,"sequence","");
  local_1d50[0] = local_1d40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d50,"Script sequence number","");
  pRVar17 = (pointer)0x0;
  pRVar18 = (pointer)0x0;
  pRVar19 = (pointer)0x0;
  m_key_name_06._M_string_length = in_stack_ffffffffffffdf70;
  m_key_name_06._M_dataplus._M_p = puVar10;
  m_key_name_06.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffdf80;
  description_06._M_string_length = in_stack_ffffffffffffdf90;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdf88;
  description_06.field_2._M_allocated_capacity = in_stack_ffffffffffffdf98;
  description_06.field_2._8_8_ = in_stack_ffffffffffffdfa0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffdfb8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdfa8._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdfa8._8_8_;
  ::RPCResult::RPCResult(&local_1928,NUM,m_key_name_06,description_06,inner_06,SUB81(local_1d30,0));
  local_1d70[0] = local_1d60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d70,"error","");
  local_1d90[0] = local_1d80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d90,"Verification or signing error related to the input","");
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  m_key_name_07._M_string_length = in_stack_ffffffffffffdf70;
  m_key_name_07._M_dataplus._M_p = puVar10;
  m_key_name_07.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_07.field_2._8_8_ = in_stack_ffffffffffffdf80;
  description_07._M_string_length = in_stack_ffffffffffffdf90;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdf88;
  description_07.field_2._M_allocated_capacity = in_stack_ffffffffffffdf98;
  description_07.field_2._8_8_ = in_stack_ffffffffffffdfa0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdfa8._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdfa8._8_8_;
  ::RPCResult::RPCResult(&local_18a0,STR,m_key_name_07,description_07,inner_07,SUB81(local_1d70,0));
  __l_03._M_len = 6;
  __l_03._M_array = (iterator)(local_1b58 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1f78,__l_03,(allocator_type *)&stack0xffffffffffffdfb7);
  m_key_name_08._M_string_length = in_stack_ffffffffffffdf70;
  m_key_name_08._M_dataplus._M_p = puVar10;
  m_key_name_08.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffdf80;
  description_08._M_string_length = in_stack_ffffffffffffdf90;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdf88;
  description_08.field_2._M_allocated_capacity = in_stack_ffffffffffffdf98;
  description_08.field_2._8_8_ = in_stack_ffffffffffffdfa0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar13;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdfa8._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdfa8._8_8_;
  ::RPCResult::RPCResult(&local_17d8,OBJ,m_key_name_08,description_08,inner_08,SUB81(local_17f8,0));
  uVar11 = (undefined4)((ulong)puVar10 >> 0x20);
  __l_04._M_len = 1;
  __l_04._M_array = &local_17d8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1f60,__l_04,(allocator_type *)&stack0xffffffffffffdfb6);
  uVar9 = 0;
  auVar4._4_8_ = in_stack_ffffffffffffdf70;
  auVar4._0_4_ = uVar11;
  auVar4._12_8_ = in_RDI;
  auVar4._20_8_ = in_stack_ffffffffffffdf80;
  auVar4._28_4_ = 0;
  description_09._M_string_length = in_stack_ffffffffffffdf90;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdf88;
  description_09.field_2._M_allocated_capacity = in_stack_ffffffffffffdf98;
  description_09.field_2._8_8_ = in_stack_ffffffffffffdfa0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar13;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdfa8._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdfa8._8_8_;
  ::RPCResult::RPCResult
            (&local_1580,ARR,(string)(auVar4 << 0x20),SUB81(local_1730,0),description_09,inner_09,
             true);
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)(local_16a0 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1f10,__l_05,(allocator_type *)&stack0xffffffffffffdfb5);
  m_key_name_09._M_dataplus._M_p._4_4_ = uVar11;
  m_key_name_09._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_09._M_string_length = in_stack_ffffffffffffdf70;
  m_key_name_09.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffdf80;
  description_10._M_string_length = in_stack_ffffffffffffdf90;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdf88;
  description_10.field_2._M_allocated_capacity = in_stack_ffffffffffffdf98;
  description_10.field_2._8_8_ = in_stack_ffffffffffffdfa0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar13;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdfa8._0_8_;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdfa8._8_8_;
  ::RPCResult::RPCResult(&local_14b8,OBJ,m_key_name_09,description_10,inner_10,SUB81(local_14d8,0));
  result._4_4_ = uVar11;
  result.m_type = uVar9;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdf70;
  result.m_key_name._M_string_length = (size_type)in_RDI;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffdf80;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffdf88;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffdf90;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffdf98;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffdfa0;
  result.m_optional = (bool)in_stack_ffffffffffffdfa8[0];
  result.m_skip_type_check = (bool)in_stack_ffffffffffffdfa8[1];
  result._66_6_ = in_stack_ffffffffffffdfa8._2_6_;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdfa8._8_8_;
  result.m_description._M_string_length = (size_type)pRVar13;
  result.m_description.field_2._M_allocated_capacity = (size_type)pRVar14;
  result.m_description.field_2._8_8_ = pRVar15;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar16;
  result.m_cond._M_string_length = (size_type)pRVar17;
  result.m_cond.field_2._M_allocated_capacity = (size_type)pRVar18;
  result.m_cond.field_2._8_8_ = pRVar19;
  RPCResults::RPCResults(&local_1ef8,result);
  local_1e10._M_dataplus._M_p = (pointer)&local_1e10.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e10,"signrawtransactionwithwallet","");
  local_1e30._M_dataplus._M_p = (pointer)&local_1e30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e30,"\"myhex\"","");
  HelpExampleCli(&local_1df0,&local_1e10,&local_1e30);
  local_1e70._M_dataplus._M_p = (pointer)&local_1e70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e70,"signrawtransactionwithwallet","");
  local_1e90._M_dataplus._M_p = (pointer)&local_1e90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e90,"\"myhex\"","");
  HelpExampleRpc(&local_1e50,&local_1e70,&local_1e90);
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1df0._M_dataplus._M_p != &local_1df0.field_2) {
    uVar7 = local_1df0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_1e50._M_string_length + local_1df0._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e50._M_dataplus._M_p != &local_1e50.field_2) {
      uVar7 = local_1e50.field_2._M_allocated_capacity;
    }
    if (local_1e50._M_string_length + local_1df0._M_string_length <= (ulong)uVar7) {
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_1e50,0,0,local_1df0._M_dataplus._M_p,local_1df0._M_string_length);
      goto LAB_00ce769b;
    }
  }
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_1df0,local_1e50._M_dataplus._M_p,local_1e50._M_string_length);
LAB_00ce769b:
  local_1dd0 = &local_1dc0;
  puVar2 = (ulong *)(pbVar5->_M_dataplus)._M_p;
  paVar1 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar1) {
    local_1dc0 = paVar1->_M_allocated_capacity;
    uStack_1db8 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_1dc0 = paVar1->_M_allocated_capacity;
    local_1dd0 = puVar2;
  }
  local_1da8 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar5->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_1dd0 == &local_1dc0) {
    uStack_1d98 = uStack_1db8;
    local_1db0 = &local_1da0;
  }
  else {
    local_1db0 = local_1dd0;
  }
  local_1da0 = local_1dc0;
  local_1dc8 = 0;
  local_1dc0 = local_1dc0 & 0xffffffffffffff00;
  pcVar12 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/spend.cpp:930:9)>
            ::_M_manager;
  name_09._M_string_length = in_stack_ffffffffffffdf70;
  name_09._M_dataplus._M_p = &stack0xffffffffffffdf88;
  name_09.field_2._M_allocated_capacity = (size_type)in_RDI;
  name_09.field_2._8_8_ = in_stack_ffffffffffffdf80;
  description_11.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/spend.cpp:930:9)>
       ::_M_manager;
  description_11._M_dataplus._M_p = (pointer)0x0;
  description_11._M_string_length = 0;
  description_11.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/spend.cpp:930:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar13;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffdfa8._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffdfa8._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar15;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar14;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar16;
  examples.m_examples._M_string_length = (size_type)pRVar18;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar17;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar19;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffdff0;
  local_1dd0 = &local_1dc0;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name_09,description_11,args,results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar12 != (code *)0x0) {
    (*pcVar12)(&stack0xffffffffffffdf88,&stack0xffffffffffffdf88,3);
  }
  if (local_1db0 != &local_1da0) {
    operator_delete(local_1db0,local_1da0 + 1);
  }
  if (local_1dd0 != &local_1dc0) {
    operator_delete(local_1dd0,local_1dc0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e50._M_dataplus._M_p != &local_1e50.field_2) {
    operator_delete(local_1e50._M_dataplus._M_p,local_1e50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e90._M_dataplus._M_p != &local_1e90.field_2) {
    operator_delete(local_1e90._M_dataplus._M_p,local_1e90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e70._M_dataplus._M_p != &local_1e70.field_2) {
    operator_delete(local_1e70._M_dataplus._M_p,local_1e70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1df0._M_dataplus._M_p != &local_1df0.field_2) {
    operator_delete(local_1df0._M_dataplus._M_p,local_1df0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e30._M_dataplus._M_p != &local_1e30.field_2) {
    operator_delete(local_1e30._M_dataplus._M_p,local_1e30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e10._M_dataplus._M_p != &local_1e10.field_2) {
    operator_delete(local_1e10._M_dataplus._M_p,local_1e10.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1ef8.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14b8.m_cond._M_dataplus._M_p != &local_14b8.m_cond.field_2) {
    operator_delete(local_14b8.m_cond._M_dataplus._M_p,
                    local_14b8.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14b8.m_description._M_dataplus._M_p != &local_14b8.m_description.field_2) {
    operator_delete(local_14b8.m_description._M_dataplus._M_p,
                    local_14b8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14b8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14b8.m_key_name._M_dataplus._M_p != &local_14b8.m_key_name.field_2) {
    operator_delete(local_14b8.m_key_name._M_dataplus._M_p,
                    local_14b8.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1f10);
  lVar8 = 0x198;
  do {
    if ((long *)(local_16a0 + lVar8) != *(long **)((long)local_16b0 + lVar8)) {
      operator_delete(*(long **)((long)local_16b0 + lVar8),*(long *)(local_16a0 + lVar8) + 1);
    }
    if ((long *)((long)local_16c0 + lVar8) != *(long **)((long)local_16d0 + lVar8)) {
      operator_delete(*(long **)((long)local_16d0 + lVar8),*(long *)((long)local_16c0 + lVar8) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_16f0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar8));
    if ((long *)((long)local_1700 + lVar8) != *(long **)((long)local_1710 + lVar8)) {
      operator_delete(*(long **)((long)local_1710 + lVar8),*(long *)((long)local_1700 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1f60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17d8.m_cond._M_dataplus._M_p != &local_17d8.m_cond.field_2) {
    operator_delete(local_17d8.m_cond._M_dataplus._M_p,
                    local_17d8.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17d8.m_description._M_dataplus._M_p != &local_17d8.m_description.field_2) {
    operator_delete(local_17d8.m_description._M_dataplus._M_p,
                    local_17d8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_17d8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17d8.m_key_name._M_dataplus._M_p != &local_17d8.m_key_name.field_2) {
    operator_delete(local_17d8.m_key_name._M_dataplus._M_p,
                    local_17d8.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1f78);
  lVar8 = 0x330;
  do {
    if ((long *)(local_1b58 + lVar8) != *(long **)((long)local_1b68 + lVar8)) {
      operator_delete(*(long **)((long)local_1b68 + lVar8),*(long *)(local_1b58 + lVar8) + 1);
    }
    if ((long *)((long)local_1b78 + lVar8) != *(long **)((long)local_1b88 + lVar8)) {
      operator_delete(*(long **)((long)local_1b88 + lVar8),*(long *)((long)local_1b78 + lVar8) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_1ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar8));
    if ((long *)((long)local_1bb8 + lVar8) != *(long **)((long)local_1bc8 + lVar8)) {
      operator_delete(*(long **)((long)local_1bc8 + lVar8),*(long *)((long)local_1bb8 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffdfb8);
  if (local_1d90[0] != local_1d80) {
    operator_delete(local_1d90[0],local_1d80[0] + 1);
  }
  if (local_1d70[0] != local_1d60) {
    operator_delete(local_1d70[0],local_1d60[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffdfd8);
  if (local_1d50[0] != local_1d40) {
    operator_delete(local_1d50[0],local_1d40[0] + 1);
  }
  if (local_1d30[0] != local_1d20) {
    operator_delete(local_1d30[0],local_1d20[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffdff8);
  if (local_1d10[0] != local_1d00) {
    operator_delete(local_1d10[0],local_1d00[0] + 1);
  }
  if (local_1cf0[0] != local_1ce0) {
    operator_delete(local_1cf0[0],local_1ce0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe030);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c90.m_cond._M_dataplus._M_p != &local_1c90.m_cond.field_2) {
    operator_delete(local_1c90.m_cond._M_dataplus._M_p,
                    local_1c90.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c90.m_description._M_dataplus._M_p != &local_1c90.m_description.field_2) {
    operator_delete(local_1c90.m_description._M_dataplus._M_p,
                    local_1c90.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c90.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c90.m_key_name._M_dataplus._M_p != &local_1c90.m_key_name.field_2) {
    operator_delete(local_1c90.m_key_name._M_dataplus._M_p,
                    local_1c90.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe018);
  if (local_1cd0[0] != local_1cc0) {
    operator_delete(local_1cd0[0],local_1cc0[0] + 1);
  }
  if (local_1cb0[0] != local_1ca0) {
    operator_delete(local_1cb0[0],local_1ca0[0] + 1);
  }
  if (local_1c08[0] != local_1bf8) {
    operator_delete(local_1c08[0],local_1bf8[0] + 1);
  }
  if (local_1be8[0] != local_1bd8) {
    operator_delete(local_1be8[0],local_1bd8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe048);
  if (local_1bc8[0] != local_1bb8) {
    operator_delete(local_1bc8[0],local_1bb8[0] + 1);
  }
  if (local_1ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_1ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_1ba8.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1f98);
  if (local_1b88[0] != local_1b78) {
    operator_delete(local_1b88[0],local_1b78[0] + 1);
  }
  if (local_1b68[0] != (pointer)local_1b58) {
    operator_delete(local_1b68[0],local_1b58._0_8_ + 1);
  }
  if (local_1818[0] != local_1808) {
    operator_delete(local_1818[0],local_1808[0] + 1);
  }
  if (local_17f8[0] != local_17e8) {
    operator_delete(local_17f8[0],local_17e8[0] + 1);
  }
  if (local_1750[0] != local_1740) {
    operator_delete(local_1750[0],local_1740[0] + 1);
  }
  if (local_1730[0] != local_1720) {
    operator_delete(local_1730[0],local_1720[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1f48);
  if (local_1710[0] != local_1700) {
    operator_delete(local_1710[0],local_1700[0] + 1);
  }
  if (local_16f0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_16f0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_16f0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_16f0.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1f28);
  if (local_16d0[0] != local_16c0) {
    operator_delete(local_16d0[0],local_16c0[0] + 1);
  }
  if (local_16b0[0] != (pointer)local_16a0) {
    operator_delete(local_16b0[0],local_16a0._0_8_ + 1);
  }
  if (local_14f8[0] != local_14e8) {
    operator_delete(local_14f8[0],local_14e8[0] + 1);
  }
  if (local_14d8[0] != local_14c8) {
    operator_delete(local_14d8[0],local_14c8[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1ea8);
  lVar8 = 0x318;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_3b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar8));
    plVar3 = *(long **)((long)&local_410 + lVar8 + 0x40);
    plVar6 = (long *)((long)&local_410 + lVar8 + 0x50);
    if (plVar6 != plVar3) {
      operator_delete(plVar3,*plVar6 + 1);
    }
    plVar6 = (long *)((long)&local_410 + lVar8 + 0x28);
    plVar3 = *(long **)((long)&local_410 + lVar8 + 0x18);
    if (plVar6 != plVar3) {
      operator_delete(plVar3,*plVar6 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_458 + lVar8));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + lVar8
               ));
    if ((long *)((long)local_488 + lVar8) != *(long **)((long)local_498 + lVar8)) {
      operator_delete(*(long **)((long)local_498 + lVar8),*(long *)((long)local_488 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x108;
  } while (lVar8 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1408);
  if (local_1428 != &local_1418) {
    operator_delete(local_1428,CONCAT71(uStack_1417,local_1418) + 1);
  }
  if (local_13e8[0] != local_13d8) {
    operator_delete(local_13e8[0],local_13d8[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1370._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_13c8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_13c8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13c8.val._M_dataplus._M_p != &local_13c8.val.field_2) {
    operator_delete(local_13c8.val._M_dataplus._M_p,
                    CONCAT71(local_13c8.val.field_2._M_allocated_capacity._1_7_,
                             local_13c8.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_1310[0] != local_1300) {
    operator_delete(local_1310[0],local_1300[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_12c8);
  if (local_12e8 != &local_12d8) {
    operator_delete(local_12e8,CONCAT71(uStack_12d7,local_12d8) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1ec0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_620.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620.m_opts.oneline_description._M_dataplus._M_p !=
      &local_620.m_opts.oneline_description.field_2) {
    operator_delete(local_620.m_opts.oneline_description._M_dataplus._M_p,
                    local_620.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620.m_description._M_dataplus._M_p != &local_620.m_description.field_2) {
    operator_delete(local_620.m_description._M_dataplus._M_p,
                    local_620.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_620.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_620.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620.m_names._M_dataplus._M_p != &local_620.m_names.field_2) {
    operator_delete(local_620.m_names._M_dataplus._M_p,
                    local_620.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1280);
  if (local_12a0 != &local_1290) {
    operator_delete(local_12a0,CONCAT71(uStack_128f,local_1290) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1ed8);
  lVar8 = 0x630;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_d10.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar8));
    plVar3 = *(long **)((long)&local_d70 + lVar8 + 0x40);
    plVar6 = (long *)((long)&local_d70 + lVar8 + 0x50);
    if (plVar6 != plVar3) {
      operator_delete(plVar3,*plVar6 + 1);
    }
    plVar6 = (long *)((long)&local_d70 + lVar8 + 0x28);
    plVar3 = *(long **)((long)&local_d70 + lVar8 + 0x18);
    if (plVar6 != plVar3) {
      operator_delete(plVar3,*plVar6 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_db8 + lVar8));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_dd0.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + lVar8
               ));
    if ((long *)((long)local_de8 + lVar8) != *(long **)((long)local_df8 + lVar8)) {
      operator_delete(*(long **)((long)local_df8 + lVar8),*(long *)((long)local_de8 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x108;
  } while (lVar8 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1238);
  if (local_1258 != &local_1248) {
    operator_delete(local_1258,CONCAT71(uStack_1247,local_1248) + 1);
  }
  if (local_1218[0] != local_1208) {
    operator_delete(local_1218[0],local_1208[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_11f8._M_first);
  if (local_1198[0] != local_1188) {
    operator_delete(local_1198[0],local_1188[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1150);
  if (local_1170 != &local_1160) {
    operator_delete(local_1170,CONCAT71(uStack_115f,local_1160) + 1);
  }
  if (local_1130[0] != local_1120) {
    operator_delete(local_1130[0],local_1120[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1110._M_first);
  if (local_10b0[0] != local_10a0) {
    operator_delete(local_10b0[0],local_10a0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1068);
  if (local_1088 != &local_1078) {
    operator_delete(local_1088,CONCAT71(uStack_1077,local_1078) + 1);
  }
  if (local_1048[0] != local_1038) {
    operator_delete(local_1048[0],local_1038[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1028._M_first);
  if (local_fc8[0] != local_fb8) {
    operator_delete(local_fc8[0],local_fb8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f80);
  if (local_fa0 != &local_f90) {
    operator_delete(local_fa0,CONCAT71(uStack_f8f,local_f90) + 1);
  }
  if (local_f60[0] != local_f50) {
    operator_delete(local_f60[0],local_f50[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_f40._M_first);
  if (local_ee0[0] != local_ed0) {
    operator_delete(local_ee0[0],local_ed0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e98);
  if (local_eb8 != &local_ea8) {
    operator_delete(local_eb8,CONCAT71(uStack_ea7,local_ea8) + 1);
  }
  if (local_e78[0] != local_e68) {
    operator_delete(local_e78[0],local_e68[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_e58._M_first);
  if (local_df8[0] != local_de8) {
    operator_delete(local_df8[0],local_de8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_db0);
  if (local_dd0.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_dd0.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_dd0.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_dd0.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_dd0.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_d90[0] != local_d80) {
    operator_delete(local_d90[0],local_d80[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_d70._M_first);
  if (local_d10.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_d10.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_d10.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_d10.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_6c0[0] != local_6b0) {
    operator_delete(local_6c0[0],local_6b0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_6a0._M_first);
  if (local_640[0] != local_630) {
    operator_delete(local_640[0],local_630[0] + 1);
  }
  if (local_518[0] != local_508) {
    operator_delete(local_518[0],local_508[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_4f8._M_first);
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_450);
  if (local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_430[0] != local_420) {
    operator_delete(local_430[0],local_420[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_410._M_first);
  if (local_3b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_3b0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_3b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_3b0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan signrawtransactionwithwallet()
{
    return RPCHelpMan{"signrawtransactionwithwallet",
                "\nSign inputs for raw transaction (serialized, hex-encoded).\n"
                "The second optional argument (may be null) is an array of previous transaction outputs that\n"
                "this transaction depends on but may not yet be in the block chain." +
        HELP_REQUIRING_PASSPHRASE,
                {
                    {"hexstring", RPCArg::Type::STR, RPCArg::Optional::NO, "The transaction hex string"},
                    {"prevtxs", RPCArg::Type::ARR, RPCArg::Optional::OMITTED, "The previous dependent transaction outputs",
                        {
                            {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "",
                                {
                                    {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction id"},
                                    {"vout", RPCArg::Type::NUM, RPCArg::Optional::NO, "The output number"},
                                    {"scriptPubKey", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The output script"},
                                    {"redeemScript", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "(required for P2SH) redeem script"},
                                    {"witnessScript", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "(required for P2WSH or P2SH-P2WSH) witness script"},
                                    {"amount", RPCArg::Type::AMOUNT, RPCArg::Optional::OMITTED, "(required for Segwit inputs) the amount spent"},
                                },
                            },
                        },
                    },
                    {"sighashtype", RPCArg::Type::STR, RPCArg::Default{"DEFAULT for Taproot, ALL otherwise"}, "The signature hash type. Must be one of\n"
            "       \"DEFAULT\"\n"
            "       \"ALL\"\n"
            "       \"NONE\"\n"
            "       \"SINGLE\"\n"
            "       \"ALL|ANYONECANPAY\"\n"
            "       \"NONE|ANYONECANPAY\"\n"
            "       \"SINGLE|ANYONECANPAY\""},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR_HEX, "hex", "The hex-encoded raw transaction with signature(s)"},
                        {RPCResult::Type::BOOL, "complete", "If the transaction has a complete set of signatures"},
                        {RPCResult::Type::ARR, "errors", /*optional=*/true, "Script verification errors (if there are any)",
                        {
                            {RPCResult::Type::OBJ, "", "",
                            {
                                {RPCResult::Type::STR_HEX, "txid", "The hash of the referenced, previous transaction"},
                                {RPCResult::Type::NUM, "vout", "The index of the output to spent and used as input"},
                                {RPCResult::Type::ARR, "witness", "",
                                {
                                    {RPCResult::Type::STR_HEX, "witness", ""},
                                }},
                                {RPCResult::Type::STR_HEX, "scriptSig", "The hex-encoded signature script"},
                                {RPCResult::Type::NUM, "sequence", "Script sequence number"},
                                {RPCResult::Type::STR, "error", "Verification or signing error related to the input"},
                            }},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("signrawtransactionwithwallet", "\"myhex\"")
            + HelpExampleRpc("signrawtransactionwithwallet", "\"myhex\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    CMutableTransaction mtx;
    if (!DecodeHexTx(mtx, request.params[0].get_str())) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, "TX decode failed. Make sure the tx has at least one input.");
    }

    // Sign the transaction
    LOCK(pwallet->cs_wallet);
    EnsureWalletIsUnlocked(*pwallet);

    // Fetch previous transactions (inputs):
    std::map<COutPoint, Coin> coins;
    for (const CTxIn& txin : mtx.vin) {
        coins[txin.prevout]; // Create empty map entry keyed by prevout.
    }
    pwallet->chain().findCoins(coins);

    // Parse the prevtxs array
    ParsePrevouts(request.params[1], nullptr, coins);

    int nHashType = ParseSighashString(request.params[2]);

    // Script verification errors
    std::map<int, bilingual_str> input_errors;

    bool complete = pwallet->SignTransaction(mtx, coins, nHashType, input_errors);
    UniValue result(UniValue::VOBJ);
    SignTransactionResultToJSON(mtx, complete, coins, input_errors, result);
    return result;
},
    };
}